

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_font_x.cxx
# Opt level: O2

void __thiscall Fl_Font_Descriptor::Fl_Font_Descriptor(Fl_Font_Descriptor *this,char *name)

{
  int u;
  XUtf8FontStruct *pXVar1;
  long lVar2;
  
  pXVar1 = XCreateUtf8FontStruct(fl_display,name);
  this->font = pXVar1;
  if (pXVar1 == (XUtf8FontStruct *)0x0) {
    (*Fl::warning)("bad font: %s",name);
    pXVar1 = XCreateUtf8FontStruct(fl_display,"fixed");
    this->font = pXVar1;
  }
  this->listbase = 0;
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 1) {
    this->glok[lVar2] = '\0';
  }
  return;
}

Assistant:

Fl_Font_Descriptor::Fl_Font_Descriptor(const char* name) {
  font = XCreateUtf8FontStruct(fl_display, name);
  if (!font) {
    Fl::warning("bad font: %s", name);
    font = XCreateUtf8FontStruct(fl_display, "fixed");
  }
#  if HAVE_GL
  listbase = 0;
  for (int u = 0; u < 64; u++) glok[u] = 0;
#  endif
}